

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O2

void __thiscall
Js::JavascriptWeakMap::MarkVisitKindSpecificPtrs
          (JavascriptWeakMap *this,SnapshotExtractor *extractor)

{
  ScriptContext *pSVar1;
  RecyclableObject *pRVar2;
  int i;
  bool bVar3;
  int iVar4;
  SnapshotExtractor *pSVar5;
  SnapshotExtractor *pSVar6;
  int iVar7;
  ulong uVar8;
  RecyclableObject *local_50;
  RecyclableObject *local_48;
  SnapshotExtractor *local_40;
  RecyclableObject *local_38;
  Var value;
  
  pSVar1 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  pSVar6 = (SnapshotExtractor *)this;
  if (pSVar1->TTDReplayModeEnabled == false) {
    local_48 = (RecyclableObject *)((ulong)this | 1);
  }
  else {
    local_48 = (RecyclableObject *)((ulong)this | 1);
    for (uVar8 = 0;
        uVar8 < (this->keySet).
                super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                .bucketCount; uVar8 = uVar8 + 1) {
      iVar4 = (this->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              .buckets.ptr[uVar8];
      if (iVar4 != -1) {
        iVar7 = -1;
        do {
          local_40 = (SnapshotExtractor *)CONCAT44(local_40._4_4_,iVar7);
          iVar7 = iVar4;
          while( true ) {
            if (iVar7 == -1) goto LAB_00bcca63;
            pRVar2 = (this->keySet).
                     super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                     .weakRefs.ptr[iVar7].ptr;
            if (pRVar2 != (RecyclableObject *)0x0) break;
            iVar4 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[iVar7].super_ValueEntryData<bool>.next;
            pSVar6 = (SnapshotExtractor *)&this->keySet;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt(&(this->keySet).
                        super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                       ,iVar7,(int)local_40,(uint)uVar8);
            iVar7 = iVar4;
          }
          pSVar5 = (SnapshotExtractor *)GetWeakMapKeyMapFromKey((JavascriptWeakMap *)pSVar6,pRVar2);
          if (pSVar5 != (SnapshotExtractor *)0x0) {
            local_38 = local_48;
            local_40 = pSVar5;
            bVar3 = JsUtil::
                    BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::ContainsKey((BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                   *)pSVar5,&local_38);
            pSVar6 = pSVar5;
            if (bVar3) {
              KeyMapGet(this,(WeakMapKeyMap *)local_40,&local_50);
              local_38 = pRVar2;
              pSVar6 = (SnapshotExtractor *)
                       Memory::
                       RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                       ::operator->(&pSVar1->TTDContextInfo->TTDWeakReferencePinSet);
              JsUtil::
              BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::AddNew((BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        *)pSVar6,&local_38);
            }
          }
          iVar4 = (this->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .entries.ptr[iVar7].super_ValueEntryData<bool>.next;
        } while( true );
      }
LAB_00bcca63:
    }
  }
  local_40 = (SnapshotExtractor *)&this->keySet;
  for (uVar8 = 0;
      uVar8 < (this->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              .bucketCount; uVar8 = uVar8 + 1) {
    iVar4 = (this->keySet).
            super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            .buckets.ptr[uVar8];
    if (iVar4 != -1) {
      iVar7 = -1;
      while (i = iVar4, i != -1) {
        pRVar2 = (this->keySet).
                 super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                 .weakRefs.ptr[i].ptr;
        if (pRVar2 == (RecyclableObject *)0x0) {
          iVar4 = (this->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .entries.ptr[i].super_ValueEntryData<bool>.next;
          pSVar6 = local_40;
          JsUtil::
          SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          ::RemoveAt((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                      *)local_40,i,iVar7,(uint)uVar8);
        }
        else {
          local_38 = (RecyclableObject *)0x0;
          pSVar5 = (SnapshotExtractor *)GetWeakMapKeyMapFromKey((JavascriptWeakMap *)pSVar6,pRVar2);
          if (pSVar5 != (SnapshotExtractor *)0x0) {
            local_50 = local_48;
            pSVar6 = pSVar5;
            bVar3 = JsUtil::
                    BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::ContainsKey((BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                   *)pSVar5,&local_50);
            if (bVar3) {
              KeyMapGet(this,(WeakMapKeyMap *)pSVar5,&local_38);
              pSVar6 = extractor;
              TTD::SnapshotExtractor::MarkVisitVar(extractor,local_38);
            }
          }
          iVar4 = (this->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .entries.ptr[i].super_ValueEntryData<bool>.next;
          iVar7 = i;
        }
      }
    }
  }
  return;
}

Assistant:

void JavascriptWeakMap::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        //All weak things should be reachable from another root so no need to mark but do need to repopulate the pin sets if in replay mode
        Js::ScriptContext* scriptContext = this->GetScriptContext();
        if(scriptContext->IsTTDReplayModeEnabled())
        {
            this->Map([&](RecyclableObject* key, Js::Var value)
            {
                scriptContext->TTDContextInfo->TTDWeakReferencePinSet->AddNew(key);
            });
        }

        //Keys are weak so are always reachable from somewhere else but values are not so we must walk them
        this->Map([&](RecyclableObject* key, Js::Var value)
        {
            extractor->MarkVisitVar(value);
        });
    }